

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::BaseCase::verifyMessageExists
          (BaseCase *this,MessageData *message,GLenum source,GLenum type)

{
  TestLog *pTVar1;
  bool bVar2;
  allocator<char> local_191;
  undefined1 local_190 [384];
  
  if (type != 0x1100 && source != 0x1100) {
    pTVar1 = ((this->super_ErrorCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log
    ;
    if (((message->id).source != 0) && ((message->id).type != 0)) {
      return true;
    }
    bVar2 = isDebugContext(this);
    local_190._0_8_ = pTVar1;
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_190,"Message was not reported as expected",&local_191);
      tcu::ResultCollector::addResult(&this->m_results,QP_TEST_RESULT_FAIL,(string *)local_190);
      std::__cxx11::string::~string((string *)local_190);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_190 + 8));
      std::operator<<((ostream *)(local_190 + 8),"A message was expected but none was reported");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_190,"Verification accuracy is lacking without a debug context",
                 &local_191);
      tcu::ResultCollector::addResult
                (&this->m_results,QP_TEST_RESULT_QUALITY_WARNING,(string *)local_190);
      std::__cxx11::string::~string((string *)local_190);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_190 + 8));
      std::operator<<((ostream *)(local_190 + 8),
                      "A message was expected but none was reported. Running without a debug context"
                     );
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_190 + 8));
  }
  return false;
}

Assistant:

bool BaseCase::verifyMessageExists (const MessageData& message, GLenum source, GLenum type)
{
	TestLog& log = m_testCtx.getLog();

	if (source == GL_DONT_CARE || type == GL_DONT_CARE)
		return false;
	else if (message.id.source == GL_NONE || message.id.type == GL_NONE)
	{
		if (isDebugContext())
		{
			m_results.addResult(QP_TEST_RESULT_FAIL, "Message was not reported as expected");
			log << TestLog::Message << "A message was expected but none was reported" << TestLog::EndMessage;
		}
		else
		{
			m_results.addResult(QP_TEST_RESULT_QUALITY_WARNING, "Verification accuracy is lacking without a debug context");
			log << TestLog::Message << "A message was expected but none was reported. Running without a debug context" << TestLog::EndMessage;
		}
		return false;
	}
	else
		return true;
}